

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,literal_expression *e)

{
  token_type tVar1;
  token *ptVar2;
  wstring *this_00;
  wostream *pwVar3;
  double dVar4;
  wstring local_200 [32];
  wstring_view local_1e0;
  wostringstream local_1d0 [8];
  wostringstream _woss;
  mjs local_48 [16];
  wstring local_38;
  literal_expression *local_18;
  literal_expression *e_local;
  print_visitor *this_local;
  
  local_18 = e;
  e_local = (literal_expression *)this;
  ptVar2 = literal_expression::t(e);
  tVar1 = token::type(ptVar2);
  if (tVar1 == numeric_literal) {
    pwVar3 = this->os_;
    ptVar2 = literal_expression::t(local_18);
    dVar4 = token::dvalue(ptVar2);
    std::wostream::operator<<(pwVar3,dVar4);
  }
  else if (tVar1 == string_literal) {
    pwVar3 = std::operator<<(this->os_,'\"');
    ptVar2 = literal_expression::t(local_18);
    this_00 = token::text_abi_cxx11_(ptVar2);
    local_48 = (mjs  [16])
               std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)this_00);
    cpp_quote_abi_cxx11_(&local_38,local_48,local_48._8_8_);
    pwVar3 = std::operator<<(pwVar3,(wstring *)&local_38);
    std::operator<<(pwVar3,'\"');
    std::__cxx11::wstring::~wstring((wstring *)&local_38);
  }
  else if (tVar1 == false_) {
    std::operator<<(this->os_,"false");
  }
  else if (tVar1 == null_) {
    std::operator<<(this->os_,"null");
  }
  else {
    if (tVar1 != true_) {
      std::__cxx11::wostringstream::wostringstream(local_1d0);
      pwVar3 = std::operator<<((wostream *)local_1d0,"Not implemented: ");
      mjs::operator<<(pwVar3,(syntax_node *)local_18);
      std::__cxx11::wostringstream::str();
      local_1e0 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_200)
      ;
      throw_runtime_error(&local_1e0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/printer.cpp"
                          ,0x20);
    }
    std::operator<<(this->os_,"true");
  }
  return;
}

Assistant:

void operator()(const literal_expression& e) {
        switch (e.t().type()) {
        case token_type::null_:            os_ << "null"; return;
        case token_type::true_:            os_ << "true"; return;
        case token_type::false_:           os_ << "false"; return;
        case token_type::numeric_literal:  os_ << e.t().dvalue(); return;
        case token_type::string_literal:   os_ << '"' << cpp_quote(e.t().text()) << '"'; return;
        default:
            NOT_IMPLEMENTED(e);
        }
    }